

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repattrn.cpp
# Opt level: O3

UBool __thiscall icu_63::RegexPattern::operator==(RegexPattern *this,RegexPattern *other)

{
  ushort uVar1;
  short sVar2;
  UnicodeString *this_00;
  UnicodeString *text;
  UText *ut;
  long lVar3;
  UBool UVar4;
  int32_t len;
  UText *ut_00;
  int32_t iVar5;
  
  if ((this->fFlags == other->fFlags) && (this->fDeferredStatus == other->fDeferredStatus)) {
    this_00 = this->fPatternString;
    if ((this_00 != (UnicodeString *)0x0) &&
       (text = other->fPatternString, text != (UnicodeString *)0x0)) {
      uVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
      if ((uVar1 & 1) != 0) {
        return *(byte *)&text->fUnion & 1;
      }
      if ((short)uVar1 < 0) {
        len = (this_00->fUnion).fFields.fLength;
      }
      else {
        len = (int)(short)uVar1 >> 5;
      }
      sVar2 = (text->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar5 = (text->fUnion).fFields.fLength;
      }
      else {
        iVar5 = (int)sVar2 >> 5;
      }
      if (((int)sVar2 & 1U) != 0) {
        return '\0';
      }
      if (len != iVar5) {
        return '\0';
      }
      UVar4 = UnicodeString::doEquals(this_00,text,len);
      return UVar4 != '\0';
    }
    ut = this->fPattern;
    ut_00 = other->fPattern;
    if (ut == (UText *)0x0) {
      if (ut_00 == (UText *)0x0) {
        return '\x01';
      }
    }
    else if (ut_00 != (UText *)0x0) {
      lVar3 = ut->chunkNativeStart;
      if (((lVar3 < 1) && (-lVar3 < (long)ut->nativeIndexingLimit)) &&
         ((ushort)ut->chunkContents[-lVar3] < 0xdc00)) {
        ut->chunkOffset = (int32_t)-lVar3;
      }
      else {
        utext_setNativeIndex_63(ut,0);
        ut_00 = other->fPattern;
      }
      lVar3 = ut_00->chunkNativeStart;
      if (((lVar3 < 1) && (-lVar3 < (long)ut_00->nativeIndexingLimit)) &&
         ((ushort)ut_00->chunkContents[-lVar3] < 0xdc00)) {
        ut_00->chunkOffset = (int32_t)-lVar3;
      }
      else {
        utext_setNativeIndex_63(ut_00,0);
        ut_00 = other->fPattern;
      }
      UVar4 = utext_equals_63(this->fPattern,ut_00);
      return UVar4;
    }
  }
  return '\0';
}

Assistant:

UBool   RegexPattern::operator ==(const RegexPattern &other) const {
    if (this->fFlags == other.fFlags && this->fDeferredStatus == other.fDeferredStatus) {
        if (this->fPatternString != NULL && other.fPatternString != NULL) {
            return *(this->fPatternString) == *(other.fPatternString);
        } else if (this->fPattern == NULL) {
            if (other.fPattern == NULL) {
                return TRUE;
            }
        } else if (other.fPattern != NULL) {
            UTEXT_SETNATIVEINDEX(this->fPattern, 0);
            UTEXT_SETNATIVEINDEX(other.fPattern, 0);
            return utext_equals(this->fPattern, other.fPattern);
        }
    }
    return FALSE;
}